

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::Int32ParseTester::_InternalSerialize
          (Int32ParseTester *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint32_t *puVar6;
  RepeatedField<int> *pRVar7;
  const_pointer piVar8;
  uint8_t *puVar9;
  LogMessage *pLVar10;
  Int32ParseTester *extendee;
  UnknownFieldSet *unknown_fields;
  const_pointer piVar11;
  int byte_size_5;
  int byte_size_4;
  int byte_size_3;
  int byte_size_2;
  int byte_size_1;
  int byte_size;
  uint32_t cached_has_bits;
  Int32ParseTester *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Int32ParseTester *this_local;
  const_pointer end;
  const_pointer it;
  EpsCopyOutputStream *local_448;
  byte *local_420;
  ulong local_418;
  const_pointer end_1;
  const_pointer it_1;
  EpsCopyOutputStream *local_3f8;
  byte *local_3d0;
  ulong local_3c8;
  const_pointer end_2;
  const_pointer it_2;
  EpsCopyOutputStream *local_3a8;
  byte *local_380;
  ulong local_378;
  const_pointer end_3;
  const_pointer it_3;
  EpsCopyOutputStream *local_358;
  byte *local_330;
  ulong local_328;
  const_pointer end_4;
  const_pointer it_4;
  EpsCopyOutputStream *local_308;
  byte *local_2e0;
  ulong local_2d8;
  const_pointer end_5;
  const_pointer it_5;
  EpsCopyOutputStream *local_2b8;
  byte *local_290;
  ulong local_288;
  LogMessage local_1e8;
  Voidify local_1d1;
  byte *local_1d0;
  undefined4 local_1c8;
  undefined4 local_1c4;
  EpsCopyOutputStream *local_1c0;
  byte *local_1b8;
  uint local_1b0;
  byte local_1a9;
  LogMessage local_1a8;
  Voidify local_191;
  byte *local_190;
  uint local_188;
  int local_184;
  EpsCopyOutputStream *local_180;
  byte *local_178;
  uint local_170;
  byte local_169;
  LogMessage local_168;
  Voidify local_151;
  byte *local_150;
  uint local_148;
  int local_144;
  EpsCopyOutputStream *local_140;
  byte *local_138;
  uint local_130;
  byte local_129;
  LogMessage local_128;
  Voidify local_111;
  byte *local_110;
  uint local_108;
  int local_104;
  EpsCopyOutputStream *local_100;
  byte *local_f8;
  uint local_f0;
  byte local_e9;
  LogMessage local_e8;
  Voidify local_d1;
  byte *local_d0;
  uint local_c8;
  int local_c4;
  EpsCopyOutputStream *local_c0;
  byte *local_b8;
  uint local_b0;
  byte local_a9;
  LogMessage local_a8;
  Voidify local_91;
  byte *local_90;
  uint local_88;
  int local_84;
  EpsCopyOutputStream *local_80;
  byte *local_78;
  uint local_6c;
  EpsCopyOutputStream *local_68;
  uint local_5c;
  EpsCopyOutputStream *local_58;
  uint local_4c;
  EpsCopyOutputStream *local_48;
  uint local_3c;
  EpsCopyOutputStream *local_38;
  uint local_2c;
  EpsCopyOutputStream *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  puVar6 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar5 = *puVar6;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar5 & 1) != 0) {
    iVar2 = _internal_optional_int32_lowfield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,iVar2,target);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_int32_lowfield_cached_byte_size_);
  if (0 < (int)uVar3) {
    pRVar7 = _internal_repeated_int32_lowfield(this);
    local_1d0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_1c4 = 2;
    local_1c8 = 2;
    local_1c0 = stream;
    if (stream->end_ <= local_1d0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1e8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d1,pLVar10);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1e8);
    }
    local_1b0 = 0x12;
    local_1b8 = local_1d0;
    while (0x7f < local_1b0) {
      *local_1b8 = (byte)local_1b0 | 0x80;
      local_1b8 = local_1b8 + 1;
      local_1b0 = 0;
    }
    *local_1b8 = (byte)local_1b0;
    local_68 = (EpsCopyOutputStream *)(local_1b8 + 1);
    for (local_5c = uVar3; 0x7f < local_5c; local_5c = local_5c >> 7) {
      *(byte *)local_68 = (byte)local_5c | 0x80;
      local_68 = (EpsCopyOutputStream *)((long)local_68 + 1);
    }
    local_448 = (EpsCopyOutputStream *)((long)local_68 + 1);
    *(byte *)local_68 = (byte)local_5c;
    local_1b8 = local_1b8 + 1;
    local_68 = local_448;
    piVar8 = google::protobuf::RepeatedField<int>::data(pRVar7);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar7);
    end = piVar8;
    do {
      local_420 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_448);
      piVar11 = end + 1;
      for (local_418 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end);
          0x7f < local_418; local_418 = local_418 >> 7) {
        *local_420 = (byte)local_418 | 0x80;
        local_420 = local_420 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_420 + 1);
      *local_420 = (byte)local_418;
      end = piVar11;
      local_448 = stream_local;
    } while (piVar11 < piVar8 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_int32_lowfield_cached_byte_size_);
  if (0 < (int)uVar3) {
    pRVar7 = _internal_packed_int32_lowfield(this);
    local_190 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_184 = 3;
    local_188 = 2;
    local_1a9 = 0;
    local_180 = stream;
    if (stream->end_ <= local_190) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_1a9 = 1;
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1a8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_191,pLVar10);
    }
    if ((local_1a9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1a8);
    }
    local_178 = local_190;
    for (local_170 = local_184 << 3 | local_188; 0x7f < local_170; local_170 = local_170 >> 7) {
      *local_178 = (byte)local_170 | 0x80;
      local_178 = local_178 + 1;
    }
    *local_178 = (byte)local_170;
    local_58 = (EpsCopyOutputStream *)(local_178 + 1);
    for (local_4c = uVar3; 0x7f < local_4c; local_4c = local_4c >> 7) {
      *(byte *)local_58 = (byte)local_4c | 0x80;
      local_58 = (EpsCopyOutputStream *)((long)local_58 + 1);
    }
    local_3f8 = (EpsCopyOutputStream *)((long)local_58 + 1);
    *(byte *)local_58 = (byte)local_4c;
    local_178 = local_178 + 1;
    local_58 = local_3f8;
    piVar8 = google::protobuf::RepeatedField<int>::data(pRVar7);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar7);
    end_1 = piVar8;
    do {
      local_3d0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_3f8);
      piVar11 = end_1 + 1;
      for (local_3c8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_1);
          0x7f < local_3c8; local_3c8 = local_3c8 >> 7) {
        *local_3d0 = (byte)local_3c8 | 0x80;
        local_3d0 = local_3d0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_3d0 + 1);
      *local_3d0 = (byte)local_3c8;
      end_1 = piVar11;
      local_3f8 = stream_local;
    } while (piVar11 < piVar8 + iVar4);
  }
  if ((uVar5 & 4) != 0) {
    puVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar2 = _internal_other_field(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(99,iVar2,puVar9);
  }
  if ((uVar5 & 2) != 0) {
    puVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar2 = _internal_optional_int32_midfield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x3e9,iVar2,puVar9)
    ;
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_int32_midfield_cached_byte_size_);
  if (0 < (int)uVar3) {
    pRVar7 = _internal_repeated_int32_midfield(this);
    local_150 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_144 = 0x3ea;
    local_148 = 2;
    local_169 = 0;
    local_140 = stream;
    if (stream->end_ <= local_150) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_169 = 1;
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_168);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_151,pLVar10);
    }
    if ((local_169 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_168);
    }
    local_138 = local_150;
    for (local_130 = local_144 << 3 | local_148; 0x7f < local_130; local_130 = local_130 >> 7) {
      *local_138 = (byte)local_130 | 0x80;
      local_138 = local_138 + 1;
    }
    *local_138 = (byte)local_130;
    local_48 = (EpsCopyOutputStream *)(local_138 + 1);
    for (local_3c = uVar3; 0x7f < local_3c; local_3c = local_3c >> 7) {
      *(byte *)local_48 = (byte)local_3c | 0x80;
      local_48 = (EpsCopyOutputStream *)((long)local_48 + 1);
    }
    local_3a8 = (EpsCopyOutputStream *)((long)local_48 + 1);
    *(byte *)local_48 = (byte)local_3c;
    local_138 = local_138 + 1;
    local_48 = local_3a8;
    piVar8 = google::protobuf::RepeatedField<int>::data(pRVar7);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar7);
    end_2 = piVar8;
    do {
      local_380 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_3a8);
      piVar11 = end_2 + 1;
      for (local_378 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_2);
          0x7f < local_378; local_378 = local_378 >> 7) {
        *local_380 = (byte)local_378 | 0x80;
        local_380 = local_380 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_380 + 1);
      *local_380 = (byte)local_378;
      end_2 = piVar11;
      local_3a8 = stream_local;
    } while (piVar11 < piVar8 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_int32_midfield_cached_byte_size_);
  if (0 < (int)uVar3) {
    pRVar7 = _internal_packed_int32_midfield(this);
    local_110 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_104 = 0x3eb;
    local_108 = 2;
    local_129 = 0;
    local_100 = stream;
    if (stream->end_ <= local_110) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_128,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_129 = 1;
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_128);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_111,pLVar10);
    }
    if ((local_129 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_128);
    }
    local_f8 = local_110;
    for (local_f0 = local_104 << 3 | local_108; 0x7f < local_f0; local_f0 = local_f0 >> 7) {
      *local_f8 = (byte)local_f0 | 0x80;
      local_f8 = local_f8 + 1;
    }
    *local_f8 = (byte)local_f0;
    local_38 = (EpsCopyOutputStream *)(local_f8 + 1);
    for (local_2c = uVar3; 0x7f < local_2c; local_2c = local_2c >> 7) {
      *(byte *)local_38 = (byte)local_2c | 0x80;
      local_38 = (EpsCopyOutputStream *)((long)local_38 + 1);
    }
    local_358 = (EpsCopyOutputStream *)((long)local_38 + 1);
    *(byte *)local_38 = (byte)local_2c;
    local_f8 = local_f8 + 1;
    local_38 = local_358;
    piVar8 = google::protobuf::RepeatedField<int>::data(pRVar7);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar7);
    end_3 = piVar8;
    do {
      local_330 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_358);
      piVar11 = end_3 + 1;
      for (local_328 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_3);
          0x7f < local_328; local_328 = local_328 >> 7) {
        *local_330 = (byte)local_328 | 0x80;
        local_330 = local_330 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_330 + 1);
      *local_330 = (byte)local_328;
      end_3 = piVar11;
      local_358 = stream_local;
    } while (piVar11 < piVar8 + iVar4);
  }
  if ((uVar5 & 8) != 0) {
    puVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar2 = _internal_optional_int32_hifield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                             (0xf4241,iVar2,puVar9);
  }
  uVar5 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_int32_hifield_cached_byte_size_);
  if (0 < (int)uVar5) {
    pRVar7 = _internal_repeated_int32_hifield(this);
    local_d0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                         (stream,(uint8_t *)stream_local);
    local_c4 = 0xf4242;
    local_c8 = 2;
    local_e9 = 0;
    local_c0 = stream;
    if (stream->end_ <= local_d0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_e9 = 1;
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_d1,pLVar10);
    }
    if ((local_e9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_e8);
    }
    local_b8 = local_d0;
    for (local_b0 = local_c4 << 3 | local_c8; 0x7f < local_b0; local_b0 = local_b0 >> 7) {
      *local_b8 = (byte)local_b0 | 0x80;
      local_b8 = local_b8 + 1;
    }
    *local_b8 = (byte)local_b0;
    local_28 = (EpsCopyOutputStream *)(local_b8 + 1);
    for (local_1c = uVar5; 0x7f < local_1c; local_1c = local_1c >> 7) {
      *(byte *)local_28 = (byte)local_1c | 0x80;
      local_28 = (EpsCopyOutputStream *)((long)local_28 + 1);
    }
    local_308 = (EpsCopyOutputStream *)((long)local_28 + 1);
    *(byte *)local_28 = (byte)local_1c;
    local_b8 = local_b8 + 1;
    local_28 = local_308;
    piVar8 = google::protobuf::RepeatedField<int>::data(pRVar7);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar7);
    end_4 = piVar8;
    do {
      local_2e0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_308);
      piVar11 = end_4 + 1;
      for (local_2d8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_4);
          0x7f < local_2d8; local_2d8 = local_2d8 >> 7) {
        *local_2e0 = (byte)local_2d8 | 0x80;
        local_2e0 = local_2e0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_2e0 + 1);
      *local_2e0 = (byte)local_2d8;
      end_4 = piVar11;
      local_308 = stream_local;
    } while (piVar11 < piVar8 + iVar4);
  }
  uVar5 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_int32_hifield_cached_byte_size_);
  if (0 < (int)uVar5) {
    pRVar7 = _internal_packed_int32_hifield(this);
    local_90 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                         (stream,(uint8_t *)stream_local);
    local_84 = 0xf4243;
    local_88 = 2;
    local_a9 = 0;
    local_80 = stream;
    if (stream->end_ <= local_90) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_a9 = 1;
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar10);
    }
    if ((local_a9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_a8);
    }
    local_78 = local_90;
    for (local_6c = local_84 << 3 | local_88; 0x7f < local_6c; local_6c = local_6c >> 7) {
      *local_78 = (byte)local_6c | 0x80;
      local_78 = local_78 + 1;
    }
    *local_78 = (byte)local_6c;
    local_18 = (EpsCopyOutputStream *)(local_78 + 1);
    for (local_c = uVar5; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_2b8 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_78 = local_78 + 1;
    local_18 = local_2b8;
    piVar8 = google::protobuf::RepeatedField<int>::data(pRVar7);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar7);
    end_5 = piVar8;
    do {
      local_290 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_2b8);
      piVar11 = end_5 + 1;
      for (local_288 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_5);
          0x7f < local_288; local_288 = local_288 >> 7) {
        *local_290 = (byte)local_288 | 0x80;
        local_290 = local_290 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_290 + 1);
      *local_290 = (byte)local_288;
      end_5 = piVar11;
      local_2b8 = stream_local;
    } while (piVar11 < piVar8 + iVar4);
  }
  extendee = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerializeAll
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)extendee,
                            (uint8_t *)stream_local,stream);
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Int32ParseTester::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Int32ParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.Int32ParseTester)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 optional_int32_lowfield = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_optional_int32_lowfield(), target);
  }

  // repeated int32 repeated_int32_lowfield = 2;
  {
    int byte_size = this_._impl_._repeated_int32_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, this_._internal_repeated_int32_lowfield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_lowfield = 3 [features = {
  {
    int byte_size = this_._impl_._packed_int32_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          3, this_._internal_packed_int32_lowfield(), byte_size, target);
    }
  }

  // int32 other_field = 99;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        99, this_._internal_other_field(), target);
  }

  // int32 optional_int32_midfield = 1001;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1001, this_._internal_optional_int32_midfield(), target);
  }

  // repeated int32 repeated_int32_midfield = 1002;
  {
    int byte_size = this_._impl_._repeated_int32_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1002, this_._internal_repeated_int32_midfield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_midfield = 1003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1003, this_._internal_packed_int32_midfield(), byte_size, target);
    }
  }

  // int32 optional_int32_hifield = 1000001;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1000001, this_._internal_optional_int32_hifield(), target);
  }

  // repeated int32 repeated_int32_hifield = 1000002;
  {
    int byte_size = this_._impl_._repeated_int32_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1000002, this_._internal_repeated_int32_hifield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_hifield = 1000003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1000003, this_._internal_packed_int32_hifield(), byte_size, target);
    }
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.Int32ParseTester)
  return target;
}